

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O3

Vector * __thiscall Sphere::find_normal(Sphere *this,Vector *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vector *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar1 = p->z;
  dVar2 = (this->loc).z;
  dVar3 = this->radius;
  auVar4._0_8_ = p->x - (this->loc).x;
  auVar4._8_8_ = p->y - (this->loc).y;
  auVar5._8_8_ = dVar3;
  auVar5._0_8_ = dVar3;
  auVar5 = divpd(auVar4,auVar5);
  in_RDI->x = (double)auVar5._0_8_;
  in_RDI->y = (double)auVar5._8_8_;
  in_RDI->z = (dVar1 - dVar2) / dVar3;
  return in_RDI;
}

Assistant:

Vector Sphere::find_normal(   Vector&  p )
{
   return (p - loc) / radius;
}